

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

int Gia_ManMuxProfile(Mux_Man_t *p,int fWidth)

{
  int *piVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  int *__ptr;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  __ptr = (int *)calloc(1,4000);
  uVar4 = p->vTops->nSize;
  if (fWidth == 0) {
    if (1 < (int)uVar4) {
      iVar9 = 1;
      do {
        pcVar6 = Abc_NamStr(p->pNames,iVar9);
        uVar4 = atoi(pcVar6);
        if ((int)uVar4 < 0) goto LAB_0021f7c2;
        if (0x3e6 < uVar4) {
          uVar4 = 999;
        }
        __ptr[uVar4] = __ptr[uVar4] + 1;
        iVar9 = iVar9 + 1;
      } while (iVar9 < p->vTops->nSize);
    }
  }
  else if (1 < (int)uVar4) {
    pVVar3 = p->vTops->pArray;
    lVar5 = 0;
    do {
      uVar2 = *(uint *)((long)&pVVar3[1].nSize + lVar5);
      if ((int)uVar2 < 0) {
LAB_0021f7c2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      if (0x3e6 < uVar2) {
        uVar2 = 999;
      }
      __ptr[uVar2] = __ptr[uVar2] + 1;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar4 * 0x10 + -0x10 != lVar5);
  }
  lVar5 = 0;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  do {
    piVar1 = __ptr + lVar5;
    iVar9 = iVar9 + (uint)(0 < *piVar1);
    iVar10 = iVar10 + (uint)(0 < piVar1[1]);
    iVar11 = iVar11 + (uint)(0 < piVar1[2]);
    iVar12 = iVar12 + (uint)(0 < piVar1[3]);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 1000);
  iVar9 = iVar12 + iVar10 + iVar11 + iVar9;
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    pcVar6 = "widths";
    if (fWidth == 0) {
      pcVar6 = "sizes";
    }
    printf("The distribution of MUX tree %s:\n",pcVar6);
    uVar7 = 0;
    iVar10 = 0;
    do {
      uVar4 = __ptr[uVar7];
      if (uVar4 != 0) {
        iVar10 = iVar10 + 1;
        if (iVar10 == 0xc) {
          putchar(10);
          iVar10 = 0;
        }
        printf("  %d=%d",uVar7 & 0xffffffff,(ulong)uVar4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 1000);
    printf("\nSummary: ");
    iVar10 = *__ptr;
    lVar5 = 1;
    do {
      iVar11 = __ptr[lVar5];
      if (__ptr[lVar5] < iVar10) {
        iVar11 = iVar10;
      }
      iVar10 = iVar11;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 1000);
    lVar5 = 0;
    printf("Max = %d  ");
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    iVar8 = 0;
    do {
      piVar1 = __ptr + lVar5;
      iVar10 = iVar10 + *piVar1;
      iVar11 = iVar11 + piVar1[1];
      iVar12 = iVar12 + piVar1[2];
      iVar8 = iVar8 + piVar1[3];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 1000);
    printf("Ave = %.2f",(double)(iVar8 + iVar11 + iVar12 + iVar10) / (double)iVar9);
    putchar(10);
    free(__ptr);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Gia_ManMuxProfile( Mux_Man_t * p, int fWidth )
{
    int i, Entry, Counter, Total;
    Vec_Int_t * vVec, * vCounts;
    vCounts = Vec_IntStart( 1000 );
    if ( fWidth )
    {
        Vec_WecForEachLevelStart( p->vTops, vVec, i, 1 )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(Vec_IntSize(vVec), 999), 1 );
    }
    else
    {
        for ( i = 1; i < Vec_WecSize(p->vTops); i++ )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(atoi(Abc_NamStr(p->pNames, i)), 999), 1 );
    }
    Total = Vec_IntCountPositive(vCounts);
    if ( Total == 0 )
        return 0;
    printf( "The distribution of MUX tree %s:\n", fWidth ? "widths" : "sizes"  );
    Counter = 0;
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( !Entry ) continue;
        if ( ++Counter == 12 )
            printf( "\n" ), Counter = 0;
        printf( "  %d=%d", i, Entry );
    }
    printf( "\nSummary: " );
    printf( "Max = %d  ", Vec_IntFindMax(vCounts) );
    printf( "Ave = %.2f", 1.0*Vec_IntSum(vCounts)/Total );
    printf( "\n" );
    Vec_IntFree( vCounts );
    return 1;
}